

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd2.c
# Opt level: O1

gdImagePtr gdImageCreateFromGd2(FILE *inFile)

{
  gdIOCtx *in;
  gdImagePtr pgVar1;
  
  in = gdNewFileCtx(inFile);
  if (in == (gdIOCtx *)0x0) {
    pgVar1 = (gdImagePtr)0x0;
  }
  else {
    pgVar1 = gdImageCreateFromGd2Ctx(in);
    (*in->gd_free)(in);
  }
  return pgVar1;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd2 (FILE * inFile)
{
	gdIOCtx *in = gdNewFileCtx (inFile);
	gdImagePtr im;

	if (in == NULL) return NULL;
	im = gdImageCreateFromGd2Ctx (in);

	in->gd_free (in);

	return im;
}